

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

int mpt_init(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  char *root;
  mpt_logger *log;
  char *pcVar3;
  mpt_value *extraout_RDX;
  mpt_value *pmVar4;
  mpt_value *extraout_RDX_00;
  mpt_value *extraout_RDX_01;
  mpt_value *extraout_RDX_02;
  mpt_value *extraout_RDX_03;
  mpt_value *extraout_RDX_04;
  mpt_value *extraout_RDX_05;
  mpt_value *extraout_RDX_06;
  mpt_value *extraout_RDX_07;
  bool bVar5;
  int local_9c;
  int local_78;
  int iStack_74;
  char curr;
  int env;
  int dbg;
  int ret;
  int lv;
  char *flags;
  char *debug;
  char *src;
  char *ctl;
  mpt_config *cfg;
  mpt_metatype *top;
  mpt_path p;
  char **argv_local;
  int argc_local;
  
  top = (mpt_metatype *)0x0;
  p.base = (char *)0x0;
  p.off = 0;
  p.len = 0x2e0000;
  src = (char *)0x0;
  debug = (char *)0x0;
  dbg = 0;
  p._24_8_ = argv;
  flags = getenv("MPT_DEBUG");
  if (flags != (char *)0x0) {
    iStack_74 = 1;
    iVar2 = mpt_cint(&stack0xffffffffffffff8c,flags,0,(int *)0x0);
    if (iVar2 < 0) {
      iStack_74 = 1;
    }
    else if (0xe < iStack_74) {
      iStack_74 = 0xf;
    }
    setDebug(iStack_74);
  }
  mpt_path_set((mpt_path *)&top,"mpt",-1);
  cfg = (mpt_config *)mpt_config_global((mpt_path *)&top);
  if ((mpt_metatype *)cfg == (mpt_metatype *)0x0) {
    argv_local._4_4_ = -4;
  }
  else {
    (*(((mpt_metatype *)cfg)->_vptr->convertable).convert)((mpt_convertable *)cfg,0x85,&ctl);
    pcVar3 = ctl;
    root = getenv("MPT_PREFIX_ETC");
    log = mpt_log_default();
    mpt_config_load((mpt_config *)pcVar3,root,log);
    _ret = getenv("MPT_FLAGS");
    if (_ret != (char *)0x0) {
      local_78 = 0;
      while( true ) {
        iVar2 = dbg;
        pcVar3 = _ret + 1;
        cVar1 = *_ret;
        _ret = pcVar3;
        if (cVar1 == '\0') break;
        if (cVar1 == 'E') {
          if (local_78 != 0) {
            mpt_log((mpt_logger *)0x0,"mpt_init",4,"%s");
          }
          setEnviron((char *)0x0);
        }
        else if (cVar1 == 'e') {
          iVar2 = local_78 + 1;
          bVar5 = local_78 == 0;
          local_78 = iVar2;
          if (bVar5) {
            setEnviron("mpt_*");
          }
        }
        else if (cVar1 == 'v') {
          dbg = dbg + 1;
          setDebug(iVar2);
        }
        else {
          mpt_log((mpt_logger *)0x0,"mpt_init",0x10,"%s, %c","unknown operation flag",
                  (ulong)(uint)(int)cVar1);
        }
      }
    }
    pcVar3 = (char *)0x0;
    mpt_config_set((mpt_config *)ctl,(char *)0x0,*(char **)p._24_8_,0,0);
    env = 0;
    dbg = 0;
    pmVar4 = extraout_RDX;
LAB_0012cc97:
    do {
      while( true ) {
        if (argc <= _optind) goto LAB_0012ce5e;
        pcVar3 = (char *)p._24_8_;
        env = __posix_getopt(argc,p._24_8_,"+f:c:l:Ee:v");
        iVar2 = dbg;
        if (env == -1) {
          pcVar3 = (char *)(ulong)(uint)(argc - _optind);
          env = saveArgs((mpt_metatype *)cfg,argc - _optind,(char **)(p._24_8_ + (long)_optind * 8))
          ;
          pmVar4 = extraout_RDX_01;
          goto LAB_0012ce5e;
        }
        if (env != 0x45) break;
        setEnviron((char *)0x0);
        pmVar4 = extraout_RDX_06;
      }
      pmVar4 = extraout_RDX_00;
      if (env != 99) {
        if (env != 0x65) {
          if (env == 0x66) {
            pcVar3 = (char *)_optarg;
            env = loadConfig((mpt_config *)0x0,(char *)_optarg);
            pmVar4 = extraout_RDX_02;
          }
          else {
            if (env != 0x6c) {
              if (env != 0x76) {
                env = -1;
                break;
              }
              dbg = dbg + 1;
              setDebug(iVar2);
              pmVar4 = extraout_RDX_05;
              goto LAB_0012cc97;
            }
            if (debug != (char *)0x0) {
              env = -1;
              break;
            }
            debug = (char *)_optarg;
            pcVar3 = "listen";
            env = mpt_config_set((mpt_config *)ctl,"listen",(char *)_optarg,0,0);
            pmVar4 = extraout_RDX_04;
          }
          if (env < 0) break;
          goto LAB_0012cc97;
        }
        setEnviron((char *)_optarg);
        pmVar4 = extraout_RDX_07;
        goto LAB_0012cc97;
      }
      if (src != (char *)0x0) {
        env = -1;
        break;
      }
      src = (char *)_optarg;
      pcVar3 = "connect";
      env = mpt_config_set((mpt_config *)ctl,"connect",(char *)_optarg,0,0);
      pmVar4 = extraout_RDX_03;
    } while (-1 < env);
LAB_0012ce5e:
    (*cfg->_vptr->assign)(cfg,(mpt_path *)pcVar3,pmVar4);
    atexit(clearConfig);
    if (env < 0) {
      local_9c = env;
    }
    else {
      local_9c = _optind;
    }
    argv_local._4_4_ = local_9c;
  }
  return argv_local._4_4_;
}

Assistant:

extern int mpt_init(int argc, char * const argv[])
{
	MPT_STRUCT(path) p = MPT_PATH_INIT;
	MPT_INTERFACE(metatype) *top;
	MPT_INTERFACE(config) *cfg;
	const char *ctl = 0, *src = 0, *debug, *flags;
	int lv = 0, ret;
	
	if ((debug = getenv("MPT_DEBUG"))) {
		int dbg = 1;
		if (mpt_cint(&dbg, debug, 0, 0) < 0) {
			dbg = 1;
		}
		else if (dbg > 0xe) {
			dbg = 0xf;
		}
		setDebug(dbg);
	}
	/* use global mpt config section */
	mpt_path_set(&p, "mpt", -1);
	if (!(top = mpt_config_global(&p))) {
		return MPT_ERROR(BadOperation);
	}
	MPT_metatype_convert(top, MPT_ENUM(TypeConfigPtr), &cfg);
	
	/* load configs in `etc` subdirectory */
	mpt_config_load(cfg, getenv("MPT_PREFIX_ETC"), mpt_log_default());
	
	/* additional flags from enfironment */
	if ((flags = getenv("MPT_FLAGS"))) {
		int env = 0;
		char curr;
		while ((curr = *flags++)) {
			switch (curr) {
			  case 'v':
				setDebug(lv++);
				continue;
			  case 'E':
				/* global environment loading (masks granular) */
				if (env) {
					mpt_log(0, __func__, MPT_LOG(Warning), "%s",
					        MPT_tr("global environment load after specialized"));
				}
				setEnviron(0);
				continue;
			  case 'e':
				/* limited environment on first occurance only */
				if (!env++) {
					setEnviron("mpt_*");
				}
				continue;
			  default:
				mpt_log(0, __func__, MPT_LOG(Debug), "%s, %c",
				        MPT_tr("unknown operation flag"), curr);
			}
		}
	}
	/* set executable name */
	mpt_config_set(cfg, 0, argv[0], 0, 0);
	
	ret = 0;
	lv = 0; /* reset debug level */
	while (optind < argc) {
		switch (ret = getopt(argc, argv, "+f:c:l:Ee:v")) {
		    case -1:
			ret = saveArgs(top, argc - optind, argv + optind);
			break;
		    case 'f':
			if ((ret = loadConfig(0, optarg)) < 0) {
				break;
			}
			continue;
		    case 'c':
			if (ctl) {
				ret = MPT_ERROR(BadArgument);
				break;
			}
			ctl = optarg;
			if ((ret = mpt_config_set(cfg, "connect", ctl, 0, 0)) < 0) {
				break;
			}
			continue;
		    case 'l':
			if (src) {
				ret = MPT_ERROR(BadArgument);
				break;
			}
			src = optarg;
			if ((ret = mpt_config_set(cfg, "listen", src, 0, 0)) < 0) {
				break;
			}
			continue;
		    case 'v':
			setDebug(lv++);
			continue;
		    case 'E':
			setEnviron(0);
			continue;
		    case 'e':
			setEnviron(optarg);
			continue;
		    default:
			ret = MPT_ERROR(BadArgument);
		}
		break;
	}
	top->_vptr->unref(top);
	atexit(clearConfig);
	
	return ret < 0 ? ret : optind;
}